

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

archive_string * archive_strncat(archive_string *as,void *_p,size_t n)

{
  size_t s;
  size_t sVar1;
  archive_string *paVar2;
  size_t s_00;
  
  for (sVar1 = 0; (s_00 = n, n != sVar1 && (s_00 = sVar1, *(char *)((long)_p + sVar1) != '\0'));
      sVar1 = sVar1 + 1) {
  }
  paVar2 = archive_string_append(as,(char *)_p,s_00);
  if (paVar2 == (archive_string *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar2;
}

Assistant:

struct archive_string *
archive_strncat(struct archive_string *as, const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_string_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}